

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_filter_hex(nk_text_edit *box,nk_rune unicode)

{
  nk_rune unicode_local;
  nk_text_edit *box_local;
  
  if ((((unicode < 0x30) || (0x39 < unicode)) && ((unicode < 0x61 || (0x66 < unicode)))) &&
     ((unicode < 0x41 || (0x46 < unicode)))) {
    box_local._4_4_ = 0;
  }
  else {
    box_local._4_4_ = 1;
  }
  return box_local._4_4_;
}

Assistant:

NK_API int
nk_filter_hex(const struct nk_text_edit *box, nk_rune unicode)
{
    NK_UNUSED(box);
    if ((unicode < '0' || unicode > '9') &&
        (unicode < 'a' || unicode > 'f') &&
        (unicode < 'A' || unicode > 'F'))
        return nk_false;
    else return nk_true;
}